

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionInfo::SectionInfo
          (SectionInfo *this,string *_name,string *_description,SourceLineInfo *_lineInfo)

{
  SourceLineInfo *_lineInfo_local;
  string *_description_local;
  string *_name_local;
  SectionInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->description,(string *)_description);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  return;
}

Assistant:

SectionInfo(    std::string const& _name,
                        std::string const& _description,
                        SourceLineInfo const& _lineInfo )
        :   name( _name ),
            description( _description ),
            lineInfo( _lineInfo )
        {}